

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int Disconnectubloxx(UBLOX *publox)

{
  int iVar1;
  int local_1c;
  int res;
  int id;
  UBLOX *publox_local;
  
  local_1c = 0;
  do {
    if ((UBLOX *)addrsublox[local_1c] == publox) {
      iVar1 = Disconnectublox(publox);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsublox[local_1c] = (void *)0x0;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int Disconnectubloxx(UBLOX* publox)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsublox[id] != publox)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = Disconnectublox(publox);
	if (res != EXIT_SUCCESS) return res;

	addrsublox[id] = NULL;

	return EXIT_SUCCESS;
}